

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaStringTable::writeBlob(QMetaStringTable *this,char *out)

{
  long lVar1;
  bool bVar2;
  int offsetOfStringdataMember_00;
  qsizetype qVar3;
  int *piVar4;
  QByteArray *in_RSI;
  QHash<QByteArray,_int> *in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar5;
  QByteArray *str;
  int i;
  int offsetOfStringdataMember;
  ConstIterator end;
  ConstIterator it;
  int stringdataOffset;
  QByteArray *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QHash<QByteArray,_int>::size(in_RDI);
  offsetOfStringdataMember_00 = (int)(qVar3 << 3);
  writeString(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),in_RSI,
              offsetOfStringdataMember_00,(int *)in_stack_ffffffffffffffb0);
  QHash<QByteArray,_int>::constBegin(in_RDI);
  cVar5 = QHash<QByteArray,_int>::constEnd
                    ((QHash<QByteArray,_int> *)
                     CONCAT44(offsetOfStringdataMember_00,in_stack_ffffffffffffffb8));
  while (bVar2 = QHash<QByteArray,_int>::const_iterator::operator!=
                           ((const_iterator *)
                            CONCAT44(offsetOfStringdataMember_00,in_stack_ffffffffffffffb8),
                            (const_iterator *)in_stack_ffffffffffffffb0), bVar2) {
    piVar4 = QHash<QByteArray,_int>::const_iterator::value((const_iterator *)0x3750c3);
    in_stack_ffffffffffffffb8 = *piVar4;
    if (in_stack_ffffffffffffffb8 != 0) {
      in_stack_ffffffffffffffb0 =
           QHash<QByteArray,_int>::const_iterator::key((const_iterator *)0x3750eb);
      writeString((char *)cVar5.i.d,(int)((ulong)in_RDI >> 0x20),in_RSI,offsetOfStringdataMember_00,
                  (int *)in_stack_ffffffffffffffb0);
    }
    QHash<QByteArray,_int>::const_iterator::operator++((const_iterator *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMetaStringTable::writeBlob(char *out) const
{
    Q_ASSERT(!(reinterpret_cast<quintptr>(out) & (preferredAlignment() - 1)));

    int offsetOfStringdataMember = int(m_entries.size() * 2 * sizeof(uint));
    int stringdataOffset = 0;

    // qt_metacast expects the first string in the string table to be the class name.
    writeString(out, /*index*/ 0, m_className, offsetOfStringdataMember, stringdataOffset);

    for (Entries::ConstIterator it = m_entries.constBegin(), end = m_entries.constEnd();
         it != end; ++it) {
        const int i = it.value();
        if (i == 0)
            continue;
        const QByteArray &str = it.key();

        writeString(out, i, str, offsetOfStringdataMember, stringdataOffset);
    }
}